

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapImpl.h
# Opt level: O0

uint8_t MatchExact(Size size)

{
  ulong local_10;
  Size size_local;
  
  local_10 = size;
  if (size < 0x18) {
    local_10 = 0x18;
  }
  if ((local_10 & 7) == 0) {
    if (local_10 - 0x18 >> 3 < 0x40) {
      return (uint8_t)(local_10 - 0x18 >> 3);
    }
    __assert_fail("((size - sizeof(Chuck)) >> 3u) < 64",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Source/HeapImpl.h"
                  ,0xc0,"uint8_t MatchExact(Size)");
  }
  __assert_fail("!(size & 0x07u)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Source/HeapImpl.h"
                ,0xbe,"uint8_t MatchExact(Size)");
}

Assistant:

static uint8_t MatchExact(Size size) {
    if (size < sizeof(Chuck)) {
        size = sizeof(Chuck);
    }
    assert(!(size & 0x07u));
    // size in [24, 536)
    assert(((size - sizeof(Chuck)) >> 3u) < 64);
    return (size - sizeof(Chuck)) >> 3u;
}